

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimax.hpp
# Opt level: O0

IBot<uttt::IBoard> * __thiscall
generic_bots::MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_>::Clone
          (MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> *this)

{
  IBot<uttt::IBoard> *pIVar1;
  IBoard *in_stack_ffffffffffffffe8;
  MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> *in_stack_fffffffffffffff0;
  
  pIVar1 = (IBot<uttt::IBoard> *)operator_new(0x18);
  MinimaxBot(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(int)((ulong)pIVar1 >> 0x20));
  return pIVar1;
}

Assistant:

game::IBot<IGame> *Clone() const
    {
        return new MinimaxBot(this->game, depth);
    }